

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.hpp
# Opt level: O0

Ptr<Buffer>
myvk::Buffer::
CreateStaging<__gnu_cxx::__normal_iterator<Vertex*,std::vector<Vertex,std::allocator<Vertex>>>>
          (Ptr<Device> *device,
          __normal_iterator<Vertex_*,_std::vector<Vertex,_std::allocator<Vertex>_>_> begin,
          __normal_iterator<Vertex_*,_std::vector<Vertex,_std::allocator<Vertex>_>_> end,
          vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
          *access_queues)

{
  __normal_iterator<Vertex_*,_std::vector<Vertex,_std::allocator<Vertex>_>_> in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  VkDeviceSize in_RSI;
  element_type *in_RDI;
  undefined8 in_R8;
  Ptr<Buffer> PVar1;
  vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
  *unaff_retaddr;
  Ptr<Buffer> *ret;
  __normal_iterator<Vertex_*,_std::vector<Vertex,_std::allocator<Vertex>_>_>
  *in_stack_ffffffffffffff88;
  __normal_iterator<Vertex_*,_std::vector<Vertex,_std::allocator<Vertex>_>_>
  *in_stack_ffffffffffffff90;
  element_type *peVar2;
  uint32_t byte_offset;
  Buffer *in_stack_ffffffffffffffb0;
  __normal_iterator<Vertex_*,_std::vector<Vertex,_std::allocator<Vertex>_>_>
  in_stack_ffffffffffffffb8;
  uint3 in_stack_ffffffffffffffd4;
  VmaMemoryUsage memory_usage;
  
  memory_usage = (VmaMemoryUsage)in_stack_ffffffffffffffd4;
  peVar2 = in_RDI;
  __gnu_cxx::operator-(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  byte_offset = (uint32_t)((ulong)peVar2 >> 0x20);
  Create((Ptr<Device> *)in_RCX._M_current,in_RSI,(VmaAllocationCreateFlags)((ulong)in_R8 >> 0x20),
         (VkBufferUsageFlags)in_R8,memory_usage,unaff_retaddr);
  std::__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x13fb45
            );
  UpdateData<__gnu_cxx::__normal_iterator<Vertex*,std::vector<Vertex,std::allocator<Vertex>>>>
            (in_stack_ffffffffffffffb0,in_RCX,in_stack_ffffffffffffffb8,byte_offset);
  PVar1.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar1.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Ptr<Buffer>)PVar1.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Ptr<Buffer> CreateStaging(const Ptr<Device> &device, Iter begin, Iter end,
	                                 const std::vector<Ptr<Queue>> &access_queues = {}) {
		using T = typename std::iterator_traits<Iter>::value_type;
		Ptr<Buffer> ret =
		    Create(device, (end - begin) * sizeof(T),
		           VMA_ALLOCATION_CREATE_MAPPED_BIT | VMA_ALLOCATION_CREATE_HOST_ACCESS_SEQUENTIAL_WRITE_BIT,
		           VK_BUFFER_USAGE_TRANSFER_SRC_BIT, VMA_MEMORY_USAGE_AUTO, access_queues);
		ret->UpdateData(begin, end, 0);
		return ret;
	}